

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_create_string.cpp
# Opt level: O2

int create_string(void)

{
  ostream *poVar1;
  
  create_by_char('x',10);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,10);
  std::operator<<(poVar1," of ");
}

Assistant:

int create_string()
{
    using namespace std;
    const char ch = 'x';
    const int size = 10;
    const char * str_x = create_by_char(ch, size);
    //  str_x => xxxxxxxxxxxx, str 是一个 char 数组，
    //  * str_x => x, *str 是 char 数组的第一个元素的地址
    cout << size << " of " << ch << " is: " << str_x << endl;
    delete [] str_x;
    //  清掉之该地址处的值随机变化了
    cout << "After delete: " << str_x << endl;
}